

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.hpp
# Opt level: O1

void __thiscall
Atari2600::TIA::Player::dequeue_pixels
          (Player *this,uint8_t *target,uint8_t collision_identity,int time_now)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  bool bVar11;
  
  do {
    iVar2 = this->queue_read_pointer_;
    if (iVar2 == this->queue_write_pointer_) {
      return;
    }
    iVar3 = this->queue_[iVar2].start;
    iVar4 = this->queue_[iVar2].end;
    uVar7 = this->queue_[iVar2].pixel_position;
    iVar5 = this->queue_[iVar2].adder;
    uVar6 = this->queue_[iVar2].reverse_mask;
    if (time_now < iVar4) {
      uVar10 = time_now - iVar3;
      if (((uVar7 != 0x20) && (this->graphic[this->graphic_index] != '\0')) &&
         (0 < (int)uVar10 && (int)uVar7 < 0x20)) {
        uVar8 = 1;
        do {
          bVar9 = collision_identity;
          if ((this->graphic[this->graphic_index] >> ((uVar7 >> 2 ^ uVar6) & 0x1f) & 1) == 0) {
            bVar9 = 0;
          }
          target[uVar8 + (long)iVar3 + -1] = target[uVar8 + (long)iVar3 + -1] | bVar9;
          uVar7 = uVar7 + iVar5;
        } while (((int)uVar7 < 0x20) && (bVar11 = uVar8 < uVar10, uVar8 = uVar8 + 1, bVar11));
      }
      iVar2 = this->queue_read_pointer_;
      piVar1 = &this->queue_[iVar2].pixel_position;
      *piVar1 = *piVar1 + uVar10 * this->queue_[iVar2].adder;
      this->queue_[iVar2].start = time_now;
    }
    else {
      if (((uVar7 != 0x20) && (this->graphic[this->graphic_index] != '\0')) &&
         (0 < iVar4 - iVar3 && (int)uVar7 < 0x20)) {
        uVar8 = 1;
        do {
          bVar9 = collision_identity;
          if ((this->graphic[this->graphic_index] >> ((uVar7 >> 2 ^ uVar6) & 0x1f) & 1) == 0) {
            bVar9 = 0;
          }
          target[uVar8 + (long)iVar3 + -1] = target[uVar8 + (long)iVar3 + -1] | bVar9;
          uVar7 = uVar7 + iVar5;
        } while (((int)uVar7 < 0x20) &&
                (bVar11 = uVar8 < (uint)(iVar4 - iVar3), uVar8 = uVar8 + 1, bVar11));
      }
      this->queue_read_pointer_ = this->queue_read_pointer_ + 1U & 3;
    }
  } while (iVar4 <= time_now);
  return;
}

Assistant:

void dequeue_pixels(uint8_t *const target, const uint8_t collision_identity, const int time_now) {
				while(queue_read_pointer_ != queue_write_pointer_) {
					uint8_t *const start_ptr = &target[queue_[queue_read_pointer_].start];
					if(queue_[queue_read_pointer_].end > time_now) {
						const int length = time_now - queue_[queue_read_pointer_].start;
						output_pixels(start_ptr, length, collision_identity, queue_[queue_read_pointer_].pixel_position, queue_[queue_read_pointer_].adder, queue_[queue_read_pointer_].reverse_mask);
						queue_[queue_read_pointer_].pixel_position += length * queue_[queue_read_pointer_].adder;
						queue_[queue_read_pointer_].start = time_now;
						return;
					} else {
						output_pixels(start_ptr, queue_[queue_read_pointer_].end - queue_[queue_read_pointer_].start, collision_identity, queue_[queue_read_pointer_].pixel_position, queue_[queue_read_pointer_].adder, queue_[queue_read_pointer_].reverse_mask);
					}
					queue_read_pointer_ = (queue_read_pointer_ + 1)&3;
				}
			}